

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O3

int katherine_get_chip_id(katherine_device_t *device,char *s_chip_id)

{
  int iVar1;
  char crd [8];
  uint local_28 [2];
  undefined8 local_20;
  
  local_20 = 0xb000000000000;
  iVar1 = katherine_udp_send_exact(&device->control_socket,&local_20,8);
  if ((iVar1 == 0) &&
     (iVar1 = katherine_udp_recv_exact(&device->control_socket,local_28,8), iVar1 == 0)) {
    s_chip_id[0] = '\0';
    s_chip_id[1] = '\0';
    s_chip_id[2] = '\0';
    s_chip_id[3] = '\0';
    s_chip_id[4] = '\0';
    s_chip_id[5] = '\0';
    s_chip_id[6] = '\0';
    s_chip_id[7] = '\0';
    s_chip_id[8] = '\0';
    s_chip_id[9] = '\0';
    s_chip_id[10] = '\0';
    s_chip_id[0xb] = '\0';
    s_chip_id[0xc] = '\0';
    s_chip_id[0xd] = '\0';
    s_chip_id[0xe] = '\0';
    s_chip_id[0xf] = '\0';
    iVar1 = 0;
    sprintf(s_chip_id,"%c%d-W000%d",(ulong)(local_28[0] & 0xf | 0x40),
            (ulong)(local_28[0] >> 4 & 0xf),(ulong)(local_28[0] >> 8 & 0xfff));
  }
  return iVar1;
}

Assistant:

int
katherine_get_chip_id(katherine_device_t *device, char *s_chip_id)
{
    int res;

    res = katherine_cmd_echo_chip_id(&device->control_socket);
    if (res) goto err;

    char crd[8];
    res = katherine_cmd_wait_ack_crd(&device->control_socket, crd);
    if (res) goto err;

    int chip_id = *(int*) crd;
    int x = (chip_id & 0xF) - 1;
    int y = (chip_id >> 4) & 0xF;
    int w = (chip_id >> 8) & 0xFFF;

    memset(s_chip_id, '\0', KATHERINE_CHIP_ID_STR_SIZE);
    sprintf(s_chip_id, "%c%d-W000%d", 65 + x, y, w);
    return 0;

err:
    return res;
}